

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O0

status asio::detail::reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform
                 (reactor_op *base)

{
  socket_type s;
  bool bVar1;
  void *data;
  size_t size;
  mutable_buffer local_40;
  mutable_buffer local_30;
  status local_1c;
  reactor_op *prStack_18;
  status result;
  reactive_socket_recv_op_base<asio::mutable_buffers_1> *o;
  reactor_op *base_local;
  
  s = *(socket_type *)&base[1].super_operation.next_;
  prStack_18 = base;
  o = (reactive_socket_recv_op_base<asio::mutable_buffers_1> *)base;
  local_30 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::first
                       ((mutable_buffers_1 *)&base[1].super_operation.func_);
  data = mutable_buffer::data(&local_30);
  local_40 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::first
                       ((mutable_buffers_1 *)&prStack_18[1].super_operation.func_);
  size = mutable_buffer::size(&local_40);
  bVar1 = socket_ops::non_blocking_recv1
                    (s,data,size,prStack_18[1].ec_._M_value,
                     ((ulong)prStack_18[1].super_operation.next_ & 0x1000000000) != 0,
                     &prStack_18->ec_,&prStack_18->bytes_transferred_);
  local_1c = (status)bVar1;
  if (((local_1c == done) && (((ulong)prStack_18[1].super_operation.next_ & 0x1000000000) != 0)) &&
     (prStack_18->bytes_transferred_ == 0)) {
    local_1c = done_and_exhausted;
  }
  return local_1c;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_recv_op_base* o(
        static_cast<reactive_socket_recv_op_base*>(base));

    typedef buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs_type;

    status result;
    if (bufs_type::is_single_buffer)
    {
      result = socket_ops::non_blocking_recv1(o->socket_,
          bufs_type::first(o->buffers_).data(),
          bufs_type::first(o->buffers_).size(), o->flags_,
          (o->state_ & socket_ops::stream_oriented) != 0,
          o->ec_, o->bytes_transferred_) ? done : not_done;
    }
    else
    {
      bufs_type bufs(o->buffers_);
      result = socket_ops::non_blocking_recv(o->socket_,
          bufs.buffers(), bufs.count(), o->flags_,
          (o->state_ & socket_ops::stream_oriented) != 0,
          o->ec_, o->bytes_transferred_) ? done : not_done;
    }

    if (result == done)
      if ((o->state_ & socket_ops::stream_oriented) != 0)
        if (o->bytes_transferred_ == 0)
          result = done_and_exhausted;

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recv",
          o->ec_, o->bytes_transferred_));

    return result;
  }